

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O1

void __thiscall wallet::wallet_crypto_tests::passphrase::test_method(passphrase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
  *paVar1;
  span<const_unsigned_char,_18446744073709551615UL> correct_iv;
  uchar *puVar2;
  uint64_t uVar3;
  uint32_t rounds;
  value_type *__val;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> correct_key;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  Span<unsigned_char> bytes;
  Span<unsigned_char> bytes_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  uint256 hash_1;
  string hash;
  uchar local_88 [16];
  SecureString local_78;
  SecureString local_50;
  uchar local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = 0xde;
  local_30[3] = 0xad;
  local_30[4] = 0xbe;
  local_30[5] = 0xef;
  local_30[6] = '\0';
  local_30[7] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&local_50,"test",""
            );
  local_78.field_2._M_allocated_capacity = 0x62f63ab5bce3a0d4;
  local_78.field_2._8_8_ = 0x6a55f03df3988899;
  local_78._M_dataplus._M_p = (pointer)0xc3f4d57a07ba7afc;
  local_78._M_string_length = 0xd01048aa8d8d98a0;
  local_88[0] = 0xcf;
  local_88[1] = '/';
  local_88[2] = '&';
  local_88[3] = 0x91;
  local_88[4] = 'R';
  local_88[5] = 'm';
  local_88[6] = 0xd1;
  local_88[7] = 0xaa;
  local_88[8] = '\"';
  local_88[9] = '\b';
  local_88[10] = 0x96;
  local_88[0xb] = 0xfb;
  local_88[0xc] = 0x8b;
  local_88[0xd] = 0xf7;
  local_88[0xe] = 0xc3;
  local_88[0xf] = 'i';
  correct_iv._M_extent._M_extent_value = 0x10;
  correct_iv._M_ptr = local_88;
  correct_key._M_extent._M_extent_value = 0x20;
  correct_key._M_ptr = (pointer)&local_78;
  salt._M_extent._M_extent_value = 8;
  salt._M_ptr = local_30;
  TestCrypter::TestPassphrase(salt,&local_50,25000,correct_key,correct_iv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&local_50,local_50.field_2._M_allocated_capacity);
  }
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  bytes.m_size = 0x20;
  bytes.m_data = (uchar *)&local_78;
  GetRandBytes(bytes);
  base_blob<256u>::ToString_abi_cxx11_((string *)&local_50,&local_78);
  puVar2 = (uchar *)operator_new(8);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  bytes_00.m_size = 8;
  bytes_00.m_data = puVar2;
  GetRandBytes(bytes_00);
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>
                    (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                      super_RandomMixin<FastRandomContext>);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&local_78,
             local_50._M_dataplus._M_p,local_50._M_dataplus._M_p + local_50._M_string_length);
  rounds = 30000;
  if ((uint)uVar3 < 30000) {
    rounds = (uint)uVar3;
  }
  salt_00._M_extent._M_extent_value = 8;
  salt_00._M_ptr = puVar2;
  TestCrypter::TestPassphrase
            (salt_00,&local_78,rounds,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0),
             (span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&local_78,local_78.field_2._M_allocated_capacity);
  }
  operator_delete(puVar2,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(passphrase) {
    // These are expensive.

    TestCrypter::TestPassphrase("0000deadbeef0000"_hex_u8, "test", 25000,
                                "fc7aba077ad5f4c3a0988d8daa4810d0d4a0e3bcb53af662998898f33df0556a"_hex_u8,
                                "cf2f2691526dd1aa220896fb8bf7c369"_hex_u8);

    std::string hash(GetRandHash().ToString());
    std::vector<unsigned char> vchSalt(8);
    GetRandBytes(vchSalt);
    uint32_t rounds = m_rng.rand32();
    if (rounds > 30000)
        rounds = 30000;
    TestCrypter::TestPassphrase(vchSalt, SecureString(hash.begin(), hash.end()), rounds);
}